

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.h
# Opt level: O3

bool __thiscall pugg::Kernel::add_driver(Kernel *this,Driver *driver)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Driver *pDVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  key_type local_40;
  
  if (driver != (Driver *)0x0) {
    paVar1 = &local_40.field_2;
    pcVar2 = (driver->_server_name)._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar2,pcVar2 + (driver->_server_name)._M_string_length);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pugg::detail::Server>_>_>
                    *)this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((iVar4._M_node != (_Base_ptr)&this->field_0x8) &&
       ((int)iVar4._M_node[3]._M_color <= driver->_version)) {
      pcVar2 = (driver->_name)._M_dataplus._M_p;
      local_40._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar2,pcVar2 + (driver->_name)._M_string_length);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pugg::Driver,_std::default_delete<pugg::Driver>_>_>_>_>
                             *)&iVar4._M_node[3]._M_parent,&local_40);
      pDVar3 = (pmVar5->_M_t).
               super___uniq_ptr_impl<pugg::Driver,_std::default_delete<pugg::Driver>_>._M_t.
               super__Tuple_impl<0UL,_pugg::Driver_*,_std::default_delete<pugg::Driver>_>.
               super__Head_base<0UL,_pugg::Driver_*,_false>._M_head_impl;
      (pmVar5->_M_t).super___uniq_ptr_impl<pugg::Driver,_std::default_delete<pugg::Driver>_>._M_t.
      super__Tuple_impl<0UL,_pugg::Driver_*,_std::default_delete<pugg::Driver>_>.
      super__Head_base<0UL,_pugg::Driver_*,_false>._M_head_impl = driver;
      if (pDVar3 != (Driver *)0x0) {
        (*pDVar3->_vptr_Driver[1])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool add_driver(pugg::Driver *driver)
  {
    if (!driver)
      return false;

    auto server_iter = _servers.find(driver->server_name());

    if (server_iter == _servers.end())
      return false;

    if (server_iter->second.min_driver_version > driver->version())
      return false;

    server_iter->second.drivers[driver->name()] = std::unique_ptr<pugg::Driver>(driver);
    return true;
  }